

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hpp
# Opt level: O2

void __thiscall
nestl::impl::vector<int,nestl::allocator<int>>::
assign_iterator<nestl::has_exceptions::exception_ptr_error,int*>
          (vector<int,nestl::allocator<int>> *this,exception_ptr_error *err,
          value_type_conflict *param_3,value_type_conflict *param_4)

{
  bool bVar1;
  
  if (*(long *)(this + 8) != *(long *)(this + 0x10)) {
    __assert_fail("empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/prograholic[P]nestl/nestl/implementation/vector.hpp"
                  ,0x2aa,
                  "void nestl::impl::vector<int>::assign_iterator(OperationError &, std::input_iterator_tag, InputIterator, InputIterator) [T = int, Allocator = nestl::allocator<int>, OperationError = nestl::has_exceptions::exception_ptr_error, InputIterator = int *]"
                 );
  }
  do {
    if (param_3 == param_4) {
      return;
    }
    vector<int,_nestl::allocator<int>_>::
    push_back_nothrow<nestl::has_exceptions::exception_ptr_error>
              ((vector<int,_nestl::allocator<int>_> *)this,err,param_3);
    bVar1 = has_exceptions::exception_ptr_error::operator_cast_to_bool(err);
    param_3 = param_3 + 1;
  } while (!bVar1);
  return;
}

Assistant:

bool vector<T, A>::empty() const NESTL_NOEXCEPT_SPEC
{
    return m_start == m_finish;
}